

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O1

bool __thiscall ON_Font::SetWindowsLogfontWeight(ON_Font *this,int windows_logfont_weight)

{
  Weight font_weight;
  bool bVar1;
  
  font_weight = WeightFromWindowsLogfontWeight(windows_logfont_weight);
  bVar1 = Internal_SetFontWeightTrio
                    (this,font_weight,windows_logfont_weight,-1.23432101234321e+308,false);
  return bVar1;
}

Assistant:

bool ON_Font::SetWindowsLogfontWeight(
  int windows_logfont_weight
)
{
  const ON_Font::Weight font_weight = ON_Font::WeightFromWindowsLogfontWeight(windows_logfont_weight);
  return Internal_SetFontWeightTrio(
    font_weight, 
    windows_logfont_weight, 
    ON_UNSET_VALUE,
    windows_logfont_weight != m_windows_logfont_weight
  );
}